

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O1

QList<QGestureRecognizer_*> * __thiscall
QMultiMap<Qt::GestureType,_QGestureRecognizer_*>::values
          (QList<QGestureRecognizer_*> *__return_storage_ptr__,
          QMultiMap<Qt::GestureType,_QGestureRecognizer_*> *this,GestureType *key)

{
  QMapData<std::multimap<Qt::GestureType,_QGestureRecognizer_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QGestureRecognizer_*>_>_>_>
  *pQVar1;
  const_iterator cVar2;
  long asize;
  pair<std::_Rb_tree_const_iterator<std::pair<const_Qt::GestureType,_QGestureRecognizer_*>_>,_std::_Rb_tree_const_iterator<std::pair<const_Qt::GestureType,_QGestureRecognizer_*>_>_>
  pVar3;
  
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QGestureRecognizer **)0x0;
  (__return_storage_ptr__->d).size = 0;
  pQVar1 = (this->d).d.ptr;
  if (pQVar1 == (QMapData<std::multimap<Qt::GestureType,_QGestureRecognizer_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QGestureRecognizer_*>_>_>_>
                 *)0x0) {
    pVar3 = (pair<std::_Rb_tree_const_iterator<std::pair<const_Qt::GestureType,_QGestureRecognizer_*>_>,_std::_Rb_tree_const_iterator<std::pair<const_Qt::GestureType,_QGestureRecognizer_*>_>_>
             )ZEXT816(0);
  }
  else {
    pVar3 = std::
            _Rb_tree<Qt::GestureType,_std::pair<const_Qt::GestureType,_QGestureRecognizer_*>,_std::_Select1st<std::pair<const_Qt::GestureType,_QGestureRecognizer_*>_>,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QGestureRecognizer_*>_>_>
            ::equal_range(&(pQVar1->m)._M_t,key);
  }
  asize = 0;
  cVar2._M_node = pVar3.first._M_node._M_node;
  while (cVar2._M_node != pVar3.second._M_node._M_node) {
    cVar2._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar2._M_node);
    asize = asize + 1;
  }
  QList<QGestureRecognizer_*>::reserve(__return_storage_ptr__,asize);
  std::__copy_move<false,false,std::bidirectional_iterator_tag>::
  __copy_m<QMultiMap<Qt::GestureType,QGestureRecognizer*>::const_iterator,std::back_insert_iterator<QList<QGestureRecognizer*>>>
            ((const_iterator)pVar3.first._M_node._M_node,
             (const_iterator)pVar3.second._M_node._M_node,
             (back_insert_iterator<QList<QGestureRecognizer_*>_>)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

QList<T> values(const Key &key) const
    {
        QList<T> result;
        const auto range = equal_range(key);
        result.reserve(std::distance(range.first, range.second));
        std::copy(range.first, range.second, std::back_inserter(result));
        return result;
    }